

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

void createSimpleNeuralNetworkClassifierModel(Model *spec,char *inputName,char *outputName)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<float> *pRVar2;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  uint uVar3;
  ulong uVar4;
  Rep *pRVar5;
  RepeatedPtrFieldBase *this_00;
  ModelDescription *pMVar6;
  FeatureType *pFVar7;
  long *plVar8;
  ArrayFeatureType *pAVar9;
  StringFeatureType *pSVar10;
  FeatureDescription *pFVar11;
  DictionaryFeatureType *pDVar12;
  NeuralNetworkClassifier *this_01;
  StringVector *pSVar13;
  WeightParams *pWVar14;
  float *pfVar15;
  NeuralNetworkLayer *pNVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  void *pvVar18;
  LayerUnion LVar19;
  undefined8 *puVar20;
  int iVar21;
  Arena *pAVar22;
  string featureName;
  string probsName;
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  RepeatedPtrFieldBase *local_38;
  
  spec->specificationversion_ = 9;
  pMVar6 = spec->description_;
  local_40 = outputName;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  pRVar5 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0361:
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar6->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar6->input_).super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0361;
    (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),inputName,puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar3 = (pAVar9->shape_).current_size_;
  if (uVar3 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  pRVar1->current_size_ = uVar3 + 1;
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x20020;
  pMVar6 = spec->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  pRVar5 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e04f8:
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar6->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar6->output_).super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e04f8;
    (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),local_40,puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  uVar3 = (pAVar9->shape_).current_size_;
  if (uVar3 == (pAVar9->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  else {
    plVar8 = google::protobuf::RepeatedField<long>::elements(pRVar1);
    plVar8[uVar3] = 3;
  }
  pRVar1->current_size_ = uVar3 + 1;
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pAVar9 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar22);
    (pFVar7->Type_).multiarraytype_ = pAVar9;
  }
  pAVar9->datatype_ = 0x20020;
  pMVar6 = spec->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  pRVar5 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0691:
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar6->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar6->output_).super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0691;
    (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),"features",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 3;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pSVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar22);
    (pFVar7->Type_).stringtype_ = pSVar10;
  }
  pMVar6 = spec->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  pRVar5 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0779:
    pFVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar6->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar6->output_).super_RepeatedPtrFieldBase,pFVar11);
  }
  else {
    iVar21 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0779;
    (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  puVar20 = (undefined8 *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar18 + 0x10),"probs",puVar20);
  pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
  if (pFVar7 == (FeatureType *)0x0) {
    pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar22);
    *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pDVar12 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar22);
    (pFVar7->Type_).dictionarytype_ = pDVar12;
    pFVar7 = *(FeatureType **)((long)pvVar18 + 0x20);
    if (pFVar7 == (FeatureType *)0x0) {
      pAVar22 = (Arena *)(*(ulong *)((long)pvVar18 + 8) & 0xfffffffffffffffc);
      if ((*(ulong *)((long)pvVar18 + 8) & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                         (pAVar22);
      *(FeatureType **)((long)pvVar18 + 0x20) = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 6) {
    pDVar12 = (pFVar7->Type_).dictionarytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 6;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pDVar12 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::DictionaryFeatureType>(pAVar22);
    (pFVar7->Type_).dictionarytype_ = pDVar12;
  }
  if (pDVar12->_oneof_case_[0] != 2) {
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar12);
    pDVar12->_oneof_case_[0] = 2;
    uVar4 = (pDVar12->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pSVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringFeatureType>
                        (pAVar22);
    (pDVar12->KeyType_).stringkeytype_ = pSVar10;
  }
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"features","");
  pMVar6 = spec->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  uVar4 = (pMVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&pMVar6->predictedfeaturename_,local_80,puVar20);
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"probs","");
  pMVar6 = spec->description_;
  if (pMVar6 == (ModelDescription *)0x0) {
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar22);
    spec->description_ = pMVar6;
  }
  uVar4 = (pMVar6->super_MessageLite)._internal_metadata_.ptr_;
  puVar20 = (undefined8 *)(uVar4 & 0xfffffffffffffffc);
  if ((uVar4 & 1) != 0) {
    puVar20 = (undefined8 *)*puVar20;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            (&pMVar6->predictedprobabilitiesname_,local_60,puVar20);
  if (spec->_oneof_case_[0] == 0x193) {
    this_01 = (spec->Type_).neuralnetworkclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(spec);
    spec->_oneof_case_[0] = 0x193;
    uVar4 = (spec->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::NeuralNetworkClassifier>(pAVar22);
    (spec->Type_).neuralnetworkclassifier_ = this_01;
  }
  if (this_01->_oneof_case_[0] == 100) {
    pSVar13 = (this_01->ClassLabels_).stringclasslabels_;
  }
  else {
    CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(this_01);
    this_01->_oneof_case_[0] = 100;
    uVar4 = (this_01->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    pSVar13 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (pAVar22);
    (this_01->ClassLabels_).stringclasslabels_ = pSVar13;
  }
  pRVar5 = (pSVar13->vector_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0a2e:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pSVar13->vector_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pSVar13->vector_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar21 = (pSVar13->vector_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0a2e;
    (pSVar13->vector_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x3977b3);
  this = &this_01->layers_;
  pRVar5 = (this_01->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0a87:
    pNVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this->super_RepeatedPtrFieldBase).arena_);
    pNVar16 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&this->super_RepeatedPtrFieldBase,pNVar16);
  }
  else {
    iVar21 = (this_01->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0a87;
    (this_01->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pNVar16 = (NeuralNetworkLayer *)pRVar5->elements[iVar21];
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar16,inputName);
  pRVar5 = (pNVar16->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0ac7:
    pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar16->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar16->output_).super_RepeatedPtrFieldBase,pbVar17);
  }
  else {
    iVar21 = (pNVar16->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0ac7;
    (pNVar16->output_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pvVar18 = pRVar5->elements[iVar21];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x39779d);
  local_38 = &this->super_RepeatedPtrFieldBase;
  if (pNVar16->_oneof_case_[0] == 0x8c) {
    LVar19 = pNVar16->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar16);
    pNVar16->_oneof_case_[0] = 0x8c;
    uVar4 = (pNVar16->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar19.innerproduct_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>
                   (pAVar22);
    (pNVar16->layer_).innerproduct_ = (InnerProductLayerParams *)LVar19;
  }
  (LVar19.innerproduct_)->hasbias_ = false;
  (LVar19.innerproduct_)->inputchannels_ = 3;
  (LVar19.innerproduct_)->outputchannels_ = 3;
  iVar21 = 9;
  do {
    pWVar14 = (WeightParams *)((LVar19.activation_)->NonlinearityType_).relu_;
    if (pWVar14 == (WeightParams *)0x0) {
      uVar4 = ((LVar19.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar22);
      ((LVar19.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar14;
    }
    pRVar2 = &pWVar14->floatvalue_;
    uVar3 = (pWVar14->floatvalue_).current_size_;
    if (uVar3 == (pWVar14->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
      pfVar15 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar15[uVar3] = 1.0;
    }
    else {
      pfVar15 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar15[uVar3] = 1.0;
    }
    this_00 = local_38;
    pRVar2->current_size_ = uVar3 + 1;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  pRVar5 = (this_01->layers_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_001e0bf4:
    pNVar16 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        (local_38->arena_);
    pNVar16 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,pNVar16);
  }
  else {
    iVar21 = (this_01->layers_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar21) goto LAB_001e0bf4;
    (this_01->layers_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
    pNVar16 = (NeuralNetworkLayer *)pRVar5->elements[iVar21];
  }
  pRVar5 = (pNVar16->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    iVar21 = (pNVar16->input_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar21 < pRVar5->allocated_size) {
      (pNVar16->input_).super_RepeatedPtrFieldBase.current_size_ = iVar21 + 1;
      pvVar18 = pRVar5->elements[iVar21];
      goto LAB_001e0c48;
    }
  }
  pbVar17 = google::protobuf::Arena::Create<std::__cxx11::string>
                      ((pNVar16->input_).super_RepeatedPtrFieldBase.arena_);
  pvVar18 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pNVar16->input_).super_RepeatedPtrFieldBase,pbVar17);
LAB_001e0c48:
  std::__cxx11::string::_M_replace((ulong)pvVar18,0,*(char **)((long)pvVar18 + 8),0x39779d);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar16,local_40);
  if (pNVar16->_oneof_case_[0] == 0x8c) {
    LVar19 = pNVar16->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar16);
    pNVar16->_oneof_case_[0] = 0x8c;
    uVar4 = (pNVar16->super_MessageLite)._internal_metadata_.ptr_;
    pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar22 = *(Arena **)pAVar22;
    }
    LVar19.innerproduct_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::InnerProductLayerParams>
                   (pAVar22);
    (pNVar16->layer_).innerproduct_ = (InnerProductLayerParams *)LVar19;
  }
  (LVar19.innerproduct_)->hasbias_ = false;
  (LVar19.innerproduct_)->inputchannels_ = 3;
  (LVar19.innerproduct_)->outputchannels_ = 3;
  iVar21 = 9;
  do {
    pWVar14 = (WeightParams *)((LVar19.activation_)->NonlinearityType_).relu_;
    if (pWVar14 == (WeightParams *)0x0) {
      uVar4 = ((LVar19.convolution_)->super_MessageLite)._internal_metadata_.ptr_;
      pAVar22 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar22 = *(Arena **)pAVar22;
      }
      pWVar14 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::WeightParams>
                          (pAVar22);
      ((LVar19.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar14;
    }
    pRVar2 = &pWVar14->floatvalue_;
    uVar3 = (pWVar14->floatvalue_).current_size_;
    if (uVar3 == (pWVar14->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar2,uVar3 + 1);
      pfVar15 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar15[uVar3] = 1.0;
    }
    else {
      pfVar15 = google::protobuf::RepeatedField<float>::elements(pRVar2);
      pfVar15[uVar3] = 1.0;
    }
    pRVar2->current_size_ = uVar3 + 1;
    iVar21 = iVar21 + -1;
  } while (iVar21 != 0);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  return;
}

Assistant:

void createSimpleNeuralNetworkClassifierModel(Specification::Model *spec, const char *inputName, const char *outputName) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = spec->mutable_description()->add_input();
    topIn->set_name(inputName);
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out = spec->mutable_description()->add_output();
    out->set_name(outputName);
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out2 = spec->mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = spec->mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    spec->mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    spec->mutable_description()->set_predictedprobabilitiesname(probsName);

    const auto nn = spec->mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input(inputName);
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);
    innerProductParams->set_inputchannels(3);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output(outputName);
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(3);
    innerProductParams2->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams2->mutable_weights()->add_floatvalue(1.0);
    }
}